

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O0

void SRCTools::ResamplerModel::freeResamplerModel
               (FloatSampleProvider *model,FloatSampleProvider *source)

{
  CascadeStage *pCVar1;
  long local_40;
  FloatSampleProvider *prevStage;
  CascadeStage *cascadeStage;
  FloatSampleProvider *currentStage;
  FloatSampleProvider *source_local;
  FloatSampleProvider *model_local;
  
  pCVar1 = (CascadeStage *)model;
  while( true ) {
    cascadeStage = pCVar1;
    if (cascadeStage == (CascadeStage *)source) {
      return;
    }
    if (cascadeStage == (CascadeStage *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = __dynamic_cast(cascadeStage,&FloatSampleProvider::typeinfo,&CascadeStage::typeinfo,
                                0);
    }
    if (local_40 == 0) break;
    pCVar1 = *(CascadeStage **)(local_40 + 0x10);
    if (cascadeStage != (CascadeStage *)0x0) {
      (*(cascadeStage->super_FloatSampleProvider)._vptr_FloatSampleProvider[1])();
    }
  }
  return;
}

Assistant:

void ResamplerModel::freeResamplerModel(FloatSampleProvider &model, FloatSampleProvider &source) {
	FloatSampleProvider *currentStage = &model;
	while (currentStage != &source) {
		CascadeStage *cascadeStage = dynamic_cast<CascadeStage *>(currentStage);
		if (cascadeStage == NULL) return;
		FloatSampleProvider &prevStage = cascadeStage->source;
		delete currentStage;
		currentStage = &prevStage;
	}
}